

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

void stbi__pnm_skip_whitespace(stbi__context *s,char *c)

{
  stbi_uc *psVar1;
  stbi_uc sVar2;
  int iVar3;
  stbi_uc *psVar4;
  
  psVar1 = s->buffer_start;
LAB_0032edc0:
  do {
    if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
      iVar3 = (*(s->io).eof)(s->io_user_data);
      if (iVar3 == 0) goto LAB_0032edea;
      if (s->read_from_callbacks != 0) goto LAB_0032edda;
LAB_0032ee48:
      if ((s->io).read != (_func_int_void_ptr_char_ptr_int *)0x0) {
        iVar3 = (*(s->io).eof)(s->io_user_data);
        if (iVar3 == 0) goto LAB_0032ee7a;
        if (s->read_from_callbacks == 0) {
          return;
        }
      }
      if (s->img_buffer_end <= s->img_buffer) {
        return;
      }
LAB_0032ee7a:
      if (*c != '#') {
        return;
      }
      do {
        if ((s->io).read == (_func_int_void_ptr_char_ptr_int *)0x0) {
LAB_0032eea1:
          if (s->img_buffer_end <= s->img_buffer) goto LAB_0032edc0;
        }
        else {
          iVar3 = (*(s->io).eof)(s->io_user_data);
          if (iVar3 != 0) {
            if (s->read_from_callbacks != 0) goto LAB_0032eea1;
            goto LAB_0032edc0;
          }
        }
        if ((*c == '\n') || (*c == '\r')) goto LAB_0032edc0;
        psVar4 = s->img_buffer;
        if (psVar4 < s->img_buffer_end) {
LAB_0032ef2f:
          s->img_buffer = psVar4 + 1;
          sVar2 = *psVar4;
        }
        else {
          if (s->read_from_callbacks != 0) {
            iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
            if (iVar3 == 0) {
              s->read_from_callbacks = 0;
              s->img_buffer = psVar1;
              s->img_buffer_end = s->buffer_start + 1;
              s->buffer_start[0] = '\0';
            }
            else {
              s->img_buffer = psVar1;
              s->img_buffer_end = psVar1 + iVar3;
            }
            psVar4 = s->img_buffer;
            goto LAB_0032ef2f;
          }
          sVar2 = '\0';
        }
        *c = sVar2;
      } while( true );
    }
LAB_0032edda:
    if (s->img_buffer_end <= s->img_buffer) goto LAB_0032ee48;
LAB_0032edea:
    if ((4 < (byte)*c - 9) && (*c != 0x20)) goto LAB_0032ee48;
    psVar4 = s->img_buffer;
    if (psVar4 < s->img_buffer_end) {
LAB_0032ef69:
      s->img_buffer = psVar4 + 1;
      sVar2 = *psVar4;
    }
    else {
      if (s->read_from_callbacks != 0) {
        iVar3 = (*(s->io).read)(s->io_user_data,(char *)psVar1,s->buflen);
        if (iVar3 == 0) {
          s->read_from_callbacks = 0;
          s->img_buffer = psVar1;
          s->img_buffer_end = s->buffer_start + 1;
          s->buffer_start[0] = '\0';
        }
        else {
          s->img_buffer = psVar1;
          s->img_buffer_end = psVar1 + iVar3;
        }
        psVar4 = s->img_buffer;
        goto LAB_0032ef69;
      }
      sVar2 = '\0';
    }
    *c = sVar2;
  } while( true );
}

Assistant:

static void     stbi__pnm_skip_whitespace(stbi__context *s, char *c)
{
   for (;;) {
      while (!stbi__at_eof(s) && stbi__pnm_isspace(*c))
         *c = (char) stbi__get8(s);

      if (stbi__at_eof(s) || *c != '#')
         break;

      while (!stbi__at_eof(s) && *c != '\n' && *c != '\r' )
         *c = (char) stbi__get8(s);
   }
}